

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::GetFullNameInternal
          (cmTarget *this,string *config,bool implib,string *outPrefix,string *outBase,
          string *outSuffix)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  char *pcVar5;
  ulong uVar6;
  char *__lhs;
  bool bVar7;
  char *local_500;
  bool local_4dd;
  char *local_4c8;
  char *local_4c0;
  char *local_3e8;
  char *local_3b8;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  char *local_320;
  char *soversion;
  string local_2f8;
  string local_2d8;
  string local_2b8 [8];
  string fw_prefix;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string langPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  string langSuff;
  string ll;
  char *suffixVar;
  char *prefixVar;
  string configProp;
  char *configPostfix;
  string local_118;
  byte local_f3;
  byte local_f2;
  allocator local_f1;
  string local_f0;
  char *local_d0;
  char *targetSuffix;
  string local_c0;
  byte local_9b;
  byte local_9a;
  allocator local_99;
  string local_98;
  char *local_78;
  char *targetPrefix;
  byte local_5a;
  allocator local_59;
  string local_58;
  string *local_38;
  string *outSuffix_local;
  string *outBase_local;
  string *outPrefix_local;
  string *psStack_18;
  bool implib_local;
  string *config_local;
  cmTarget *this_local;
  
  local_38 = outSuffix;
  outSuffix_local = outBase;
  outBase_local = outPrefix;
  outPrefix_local._7_1_ = implib;
  psStack_18 = config;
  config_local = (string *)this;
  TVar3 = GetType(this);
  if ((((TVar3 == STATIC_LIBRARY) || (TVar3 = GetType(this), TVar3 == SHARED_LIBRARY)) ||
      (TVar3 = GetType(this), TVar3 == MODULE_LIBRARY)) ||
     (TVar3 = GetType(this), TVar3 == EXECUTABLE)) {
    local_5a = 0;
    targetPrefix._3_1_ = 0;
    bVar7 = false;
    if ((outPrefix_local._7_1_ & 1) != 0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_5a = 1;
      std::__cxx11::string::string((string *)&local_58,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_59);
      targetPrefix._3_1_ = 1;
      pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_58);
      bVar7 = pcVar5 == (char *)0x0;
    }
    if ((targetPrefix._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    if ((local_5a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    if (bVar7) {
      std::__cxx11::string::operator=((string *)outBase_local,"");
      std::__cxx11::string::operator=((string *)outSuffix_local,"");
      std::__cxx11::string::operator=((string *)local_38,"");
    }
    else {
      TVar3 = GetType(this);
      if (((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
         (TVar3 = GetType(this), TVar3 != EXECUTABLE)) {
        outPrefix_local._7_1_ = 0;
      }
      local_9a = 0;
      local_9b = 0;
      targetSuffix._6_1_ = 0;
      targetSuffix._5_1_ = 0;
      if ((outPrefix_local._7_1_ & 1) == 0) {
        std::allocator<char>::allocator();
        targetSuffix._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_c0,"PREFIX",(allocator *)((long)&targetSuffix + 7));
        targetSuffix._5_1_ = 1;
        local_3b8 = GetProperty(this,&local_c0);
      }
      else {
        std::allocator<char>::allocator();
        local_9a = 1;
        std::__cxx11::string::string((string *)&local_98,"IMPORT_PREFIX",&local_99);
        local_9b = 1;
        local_3b8 = GetProperty(this,&local_98);
      }
      if ((targetSuffix._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_c0);
      }
      if ((targetSuffix._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetSuffix + 7));
      }
      if ((local_9b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_98);
      }
      if ((local_9a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
      local_78 = local_3b8;
      local_f2 = 0;
      local_f3 = 0;
      configPostfix._6_1_ = 0;
      configPostfix._5_1_ = 0;
      if ((outPrefix_local._7_1_ & 1) == 0) {
        std::allocator<char>::allocator();
        configPostfix._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_118,"SUFFIX",(allocator *)((long)&configPostfix + 7));
        configPostfix._5_1_ = 1;
        local_3e8 = GetProperty(this,&local_118);
      }
      else {
        std::allocator<char>::allocator();
        local_f2 = 1;
        std::__cxx11::string::string((string *)&local_f0,"IMPORT_SUFFIX",&local_f1);
        local_f3 = 1;
        local_3e8 = GetProperty(this,&local_f0);
      }
      if ((configPostfix._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_118);
      }
      if ((configPostfix._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&configPostfix + 7));
      }
      if ((local_f3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_f0);
      }
      if ((local_f2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
      local_d0 = local_3e8;
      configProp.field_2._8_8_ = 0;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        cmsys::SystemTools::UpperCase((string *)&prefixVar,psStack_18);
        std::__cxx11::string::operator+=((string *)&prefixVar,"_POSTFIX");
        configProp.field_2._8_8_ = GetProperty(this,(string *)&prefixVar);
        if (((char *)configProp.field_2._8_8_ != (char *)0x0) &&
           ((bVar7 = IsAppBundleOnApple(this), bVar7 || (bVar7 = IsFrameworkOnApple(this), bVar7))))
        {
          configProp.field_2._8_8_ = 0;
        }
        std::__cxx11::string::~string((string *)&prefixVar);
      }
      pcVar5 = GetPrefixVariableInternal(this,(bool)(outPrefix_local._7_1_ & 1));
      __lhs = GetSuffixVariableInternal(this,(bool)(outPrefix_local._7_1_ & 1));
      GetLinkerLanguage((string *)((long)&langSuff.field_2 + 8),this,psStack_18);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        if (((local_d0 == (char *)0x0) && (__lhs != (char *)0x0)) && (*__lhs != '\0')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1d8,"_",(allocator *)(langPrefix.field_2._M_local_buf + 0xf));
          std::operator+(&local_1b8,__lhs,&local_1d8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,&local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&langSuff.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(langPrefix.field_2._M_local_buf + 0xf));
          local_d0 = cmMakefile::GetDefinition(this->Makefile,(string *)local_198);
          std::__cxx11::string::~string((string *)local_198);
        }
        if (((local_78 == (char *)0x0) && (pcVar5 != (char *)0x0)) && (*pcVar5 != '\0')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_240,"_",&local_241);
          std::operator+(&local_220,pcVar5,&local_240);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,&local_220,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&langSuff.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
          local_78 = cmMakefile::GetDefinition(this->Makefile,(string *)local_200);
          std::__cxx11::string::~string((string *)local_200);
        }
      }
      if ((local_78 == (char *)0x0) && (pcVar5 != (char *)0x0)) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_268,pcVar5,&local_269);
        local_78 = cmMakefile::GetSafeDefinition(pcVar1,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
      }
      if ((local_d0 == (char *)0x0) && (__lhs != (char *)0x0)) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_290,__lhs,(allocator *)(fw_prefix.field_2._M_local_buf + 0xf));
        local_d0 = cmMakefile::GetSafeDefinition(pcVar1,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator((allocator<char> *)(fw_prefix.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::string(local_2b8);
      bVar7 = IsFrameworkOnApple(this);
      if (bVar7) {
        GetOutputName(&local_2d8,this,psStack_18,false);
        std::__cxx11::string::operator=(local_2b8,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::operator+=(local_2b8,".framework/");
        local_78 = (char *)std::__cxx11::string::c_str();
        local_d0 = (char *)0x0;
      }
      bVar7 = IsCFBundleOnApple(this);
      if (bVar7) {
        GetCFBundleDirectory(&local_2f8,this,psStack_18,false);
        std::__cxx11::string::operator=(local_2b8,(string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::operator+=(local_2b8,"/");
        local_78 = (char *)std::__cxx11::string::c_str();
        local_d0 = (char *)0x0;
      }
      if (local_78 == (char *)0x0) {
        local_4c0 = "";
      }
      else {
        local_4c0 = local_78;
      }
      std::__cxx11::string::operator=((string *)outBase_local,local_4c0);
      GetOutputName((string *)&soversion,this,psStack_18,(bool)(outPrefix_local._7_1_ & 1));
      std::__cxx11::string::operator+=((string *)outSuffix_local,(string *)&soversion);
      std::__cxx11::string::~string((string *)&soversion);
      if (configProp.field_2._8_8_ == 0) {
        local_4c8 = "";
      }
      else {
        local_4c8 = (char *)configProp.field_2._8_8_;
      }
      std::__cxx11::string::operator+=((string *)outSuffix_local,local_4c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"SOVERSION",&local_341);
      pcVar5 = GetProperty(this,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      local_320 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        bVar2 = false;
        bVar7 = false;
        TVar3 = GetType(this);
        local_4dd = false;
        if ((TVar3 == SHARED_LIBRARY) && (local_4dd = false, (outPrefix_local._7_1_ & 1) == 0)) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string
                    ((string *)&local_368,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",&local_369);
          bVar7 = true;
          local_4dd = cmMakefile::IsOn(pcVar1,&local_368);
        }
        if (bVar7) {
          std::__cxx11::string::~string((string *)&local_368);
        }
        if (bVar2) {
          std::allocator<char>::~allocator((allocator<char> *)&local_369);
        }
        if (local_4dd != false) {
          std::__cxx11::string::operator+=((string *)outSuffix_local,"-");
          std::__cxx11::string::operator+=((string *)outSuffix_local,local_320);
        }
      }
      if (local_d0 == (char *)0x0) {
        local_500 = "";
      }
      else {
        local_500 = local_d0;
      }
      std::__cxx11::string::operator=((string *)local_38,local_500);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string((string *)(langSuff.field_2._M_local_buf + 8));
    }
  }
  else {
    std::__cxx11::string::operator=((string *)outBase_local,"");
    psVar4 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator=((string *)outSuffix_local,(string *)psVar4);
    std::__cxx11::string::operator=((string *)local_38,"");
  }
  return;
}

Assistant:

void cmTarget::GetFullNameInternal(const std::string& config,
                                   bool implib,
                                   std::string& outPrefix,
                                   std::string& outBase,
                                   std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if(this->GetType() != cmTarget::STATIC_LIBRARY &&
     this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
    }

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if(implib &&
     !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"))
    {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
    }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if(this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    implib = false;
    }

  // Compute the full name for main target types.
  const char* targetPrefix = (implib
                              ? this->GetProperty("IMPORT_PREFIX")
                              : this->GetProperty("PREFIX"));
  const char* targetSuffix = (implib
                              ? this->GetProperty("IMPORT_SUFFIX")
                              : this->GetProperty("SUFFIX"));
  const char* configPostfix = 0;
  if(!config.empty())
    {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if(configPostfix &&
       (this->IsAppBundleOnApple() || this->IsFrameworkOnApple()))
      {
      configPostfix = 0;
      }
    }
  const char* prefixVar = this->GetPrefixVariableInternal(implib);
  const char* suffixVar = this->GetSuffixVariableInternal(implib);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    if(!targetSuffix && suffixVar && *suffixVar)
      {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
      }
    if(!targetPrefix && prefixVar && *prefixVar)
      {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
      }
    }

  // if there is no prefix on the target use the cmake definition
  if(!targetPrefix && prefixVar)
    {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
    }
  // if there is no suffix on the target use the cmake definition
  if(!targetSuffix && suffixVar)
    {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
    }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if(this->IsFrameworkOnApple())
    {
    fw_prefix = this->GetOutputName(config, false);
    fw_prefix += ".framework/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  if(this->IsCFBundleOnApple())
    {
    fw_prefix = this->GetCFBundleDirectory(config, false);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix?targetPrefix:"";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, implib);

  // Append the per-configuration postfix.
  outBase += configPostfix?configPostfix:"";

  // Name shared libraries with their version number on some platforms.
  if(const char* soversion = this->GetProperty("SOVERSION"))
    {
    if(this->GetType() == cmTarget::SHARED_LIBRARY && !implib &&
       this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION"))
      {
      outBase += "-";
      outBase += soversion;
      }
    }

  // Append the suffix.
  outSuffix = targetSuffix?targetSuffix:"";
}